

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genkat.c
# Opt level: O0

void print_tag(void *out,uint32_t outlen)

{
  uint local_18;
  uint i;
  uint32_t outlen_local;
  void *out_local;
  
  if (out != (void *)0x0) {
    printf("Tag: ");
    for (local_18 = 0; local_18 < outlen; local_18 = local_18 + 1) {
      printf("%2.2x ",(ulong)*(byte *)((long)out + (ulong)local_18));
    }
    printf("\n");
  }
  return;
}

Assistant:

void print_tag(const void *out, uint32_t outlen) {
    unsigned i;
    if (out != NULL) {
        printf("Tag: ");

        for (i = 0; i < outlen; ++i) {
            printf("%2.2x ", ((uint8_t *)out)[i]);
        }

        printf("\n");
    }
}